

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_base.c
# Opt level: O0

int zt_base_encode(zt_base_definition_t *def,void *in,size_t in_bytes,void **out,size_t *out_bytes)

{
  size_t sVar1;
  int iVar2;
  ulong lcnt;
  ulong uVar3;
  long *in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  zt_base_definition_t *in_RDI;
  ulong *in_R8;
  uchar *outp;
  uchar *inp;
  size_t olen;
  size_t mod;
  size_t lcount;
  size_t ocount;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  uchar *local_68;
  uchar *local_60;
  ulong local_38;
  int local_4;
  
  if (in_RCX == (long *)0x0) {
    local_68 = (uchar *)0x0;
  }
  else {
    local_68 = (uchar *)*in_RCX;
  }
  local_60 = local_68;
  iVar2 = _valid_dictionary_p(in_RDI);
  if (iVar2 == 0) {
    local_4 = -1;
  }
  else if (in_R8 == (ulong *)0x0) {
    local_4 = -1;
  }
  else if ((in_RSI == (uchar *)0x0) || (in_RDX == 0)) {
    *in_R8 = 0;
    local_4 = 0;
  }
  else {
    lcnt = in_RDX / in_RDI->igroups;
    uVar3 = (in_RDX % (ulong)in_RDI->igroups << 3) / (ulong)in_RDI->obits;
    local_38 = lcnt * in_RDI->ogroups;
    if (uVar3 != 0) {
      if ((in_RDI->flags & zt_base_encode_with_padding) == 0) {
        uVar3 = uVar3 + 1;
      }
      else {
        uVar3 = (ulong)in_RDI->ogroups;
      }
      local_38 = uVar3 + local_38;
    }
    if (((in_RCX != (long *)0x0) && (local_68 == (uchar *)0x0)) && (*in_R8 == 0)) {
      local_60 = (uchar *)zt_calloc_p(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      *in_RCX = (long)local_60;
      *in_R8 = local_38;
    }
    uVar3 = *in_R8;
    *in_R8 = local_38;
    if (uVar3 < local_38) {
      local_4 = -2;
    }
    else if ((in_RCX == (long *)0x0) || (local_60 == (uchar *)0x0)) {
      local_4 = 0;
    }
    else {
      sVar1 = in_RDI->base;
      if (sVar1 == 0x10) {
        local_4 = _encode16(in_RDI,in_RSI,lcnt,in_RDX % (ulong)in_RDI->igroups,local_60);
      }
      else if (sVar1 == 0x20) {
        local_4 = _encode32(in_RDI,in_RSI,lcnt,in_RDX % (ulong)in_RDI->igroups,local_60);
      }
      else if (sVar1 == 0x40) {
        local_4 = _encode64(in_RDI,in_RSI,lcnt,in_RDX % (ulong)in_RDI->igroups,local_60);
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int
zt_base_encode(zt_base_definition_t * def, const void * in, size_t in_bytes, void **out, size_t *out_bytes) {
    size_t                ocount;
    size_t                lcount;
    size_t                mod;
    size_t                olen;
    const unsigned char * inp = in;
    unsigned char       * outp = out ? *(unsigned char **)out : NULL;

    if (! _valid_dictionary_p(def)) {
        return -1;
    }

    /* if we are missing out_bytes then we cannot continue */
    if (!out_bytes) {
        return -1;
    }

    /* if there is no input then we cannot continue */
    if(!in || !in_bytes) {
        *out_bytes = 0;
        return 0;
    }

    /* calculate the number of (N * 8-bit) input groups and remainder */
    lcount = in_bytes / def->igroups;                        /* number of whole input groups */
    mod = ((8 * (in_bytes % def->igroups)) / def->obits);    /* portion of partial output groups */
    ocount = (lcount * def->ogroups);                        /* number of whole output groups */

    if (mod > 0) {
        if ZT_BIT_ISSET(def->flags, zt_base_encode_with_padding) {
            ocount += def->ogroups;
        } else {
            ocount += mod + 1;
        }
    }